

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O1

void __thiscall LiteralTokenizerRule::~LiteralTokenizerRule(LiteralTokenizerRule *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_TokenizerRule)._vptr_TokenizerRule = (_func_int **)&PTR_tryMatch_00130450;
  pcVar2 = (this->literal)._M_dataplus._M_p;
  paVar1 = &(this->literal).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x38);
  return;
}

Assistant:

virtual ~LiteralTokenizerRule() = default;